

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O2

int If_CutSopBalancePinDelays(If_Man_t *p,If_Cut_t *pCut,char *pPerm)

{
  uint uVar1;
  Vec_Wec_t *p_00;
  int iVar2;
  If_Obj_t *pIVar3;
  Vec_Int_t *vCover;
  ulong uVar4;
  int pTimes [15];
  
  uVar1 = *(uint *)&pCut->field_0x1c;
  iVar2 = 0;
  if (0xffffff < uVar1) {
    if ((uVar1 & 0xff000000) == 0x1000000) {
      *pPerm = '\0';
      pIVar3 = If_CutLeaf(p,pCut,0);
      iVar2 = (int)(pIVar3->CutBest).Delay;
    }
    else {
      p_00 = p->vTtIsops[uVar1 >> 0x18];
      iVar2 = If_CutTruthLit(pCut);
      iVar2 = Abc_Lit2Var(iVar2);
      vCover = Vec_WecEntry(p_00,iVar2);
      if (vCover->nSize == 0) {
        iVar2 = -1;
      }
      else {
        for (uVar4 = 0; uVar4 < (byte)pCut->field_0x1f; uVar4 = uVar4 + 1) {
          pIVar3 = If_CutLeaf(p,pCut,(int)uVar4);
          pTimes[uVar4] = (int)(pIVar3->CutBest).Delay;
        }
        iVar2 = If_CutSopBalancePinDelaysIntInt(vCover,pTimes,(uint)(byte)pCut->field_0x1f,pPerm);
      }
    }
  }
  return iVar2;
}

Assistant:

int If_CutSopBalancePinDelays( If_Man_t * p, If_Cut_t * pCut, char * pPerm )
{
    if ( pCut->nLeaves == 0 ) // const
        return 0;
    if ( pCut->nLeaves == 1 ) // variable
    {
        pPerm[0] = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        Vec_Int_t * vCover;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
        if ( Vec_IntSize(vCover) == 0 )
            return -1;
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        return If_CutSopBalancePinDelaysIntInt( vCover, pTimes, If_CutLeaveNum(pCut), pPerm );
    }
}